

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathNodeSetFilter
               (xmlXPathParserContextPtr ctxt,xmlNodeSetPtr set,int filterOpIndex,int minPos,
               int maxPos,int hasNsNodes)

{
  int iVar1;
  int iVar2;
  xmlXPathContextPtr pxVar3;
  xmlNodePtr pxVar4;
  xmlDocPtr pxVar5;
  xmlXPathStepOp *pxVar6;
  xmlNodePtr pxVar7;
  int iVar8;
  xmlNodePtr *ppxVar9;
  int local_84;
  int nodeMax;
  xmlNodePtr *tmp;
  xmlNodePtr node_1;
  int res;
  xmlNodePtr node;
  int local_58;
  int pos;
  int j;
  int i;
  int oldpp;
  int oldcs;
  xmlXPathStepOpPtr filterOp;
  xmlDocPtr olddoc;
  xmlNodePtr oldnode;
  xmlXPathContextPtr xpctxt;
  int hasNsNodes_local;
  int maxPos_local;
  int minPos_local;
  int filterOpIndex_local;
  xmlNodeSetPtr set_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((set != (xmlNodeSetPtr)0x0) && (set->nodeNr != 0)) {
    if (set->nodeNr < minPos) {
      xmlXPathNodeSetClear(set,hasNsNodes);
    }
    else {
      pxVar3 = ctxt->context;
      pxVar4 = pxVar3->node;
      pxVar5 = pxVar3->doc;
      iVar1 = pxVar3->contextSize;
      iVar2 = pxVar3->proximityPosition;
      pxVar6 = ctxt->comp->steps;
      pxVar3->contextSize = set->nodeNr;
      local_58 = 0;
      node._4_4_ = 1;
      for (pos = 0; pos < set->nodeNr; pos = pos + 1) {
        pxVar7 = set->nodeTab[pos];
        pxVar3->node = pxVar7;
        pxVar3->proximityPosition = pos + 1;
        if ((pxVar7->type != XML_NAMESPACE_DECL) && (pxVar7->doc != (_xmlDoc *)0x0)) {
          pxVar3->doc = pxVar7->doc;
        }
        iVar8 = xmlXPathCompOpEvalToBoolean(ctxt,pxVar6 + filterOpIndex,1);
        if (ctxt->error != 0) break;
        if (iVar8 < 0) {
          xmlXPathErr(ctxt,7);
          break;
        }
        if (((iVar8 == 0) || (node._4_4_ < minPos)) || (maxPos < node._4_4_)) {
          set->nodeTab[pos] = (xmlNodePtr)0x0;
          if (pxVar7->type == XML_NAMESPACE_DECL) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)pxVar7);
          }
        }
        else {
          if (pos != local_58) {
            set->nodeTab[local_58] = pxVar7;
            set->nodeTab[pos] = (xmlNodePtr)0x0;
          }
          local_58 = local_58 + 1;
        }
        if (iVar8 != 0) {
          if (node._4_4_ == maxPos) {
            pos = pos + 1;
            break;
          }
          node._4_4_ = node._4_4_ + 1;
        }
      }
      if (hasNsNodes != 0) {
        for (; pos < set->nodeNr; pos = pos + 1) {
          pxVar7 = set->nodeTab[pos];
          if ((pxVar7 != (xmlNodePtr)0x0) && (pxVar7->type == XML_NAMESPACE_DECL)) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)pxVar7);
          }
        }
      }
      set->nodeNr = local_58;
      if ((10 < set->nodeMax) && (set->nodeNr < set->nodeMax / 2)) {
        local_84 = set->nodeNr;
        if (local_84 < 10) {
          local_84 = 10;
        }
        ppxVar9 = (xmlNodePtr *)(*xmlRealloc)(set->nodeTab,(long)local_84 << 3);
        if (ppxVar9 == (xmlNodePtr *)0x0) {
          xmlXPathPErrMemory(ctxt,"shrinking nodeset\n");
        }
        else {
          set->nodeTab = ppxVar9;
          set->nodeMax = local_84;
        }
      }
      pxVar3->node = pxVar4;
      pxVar3->doc = pxVar5;
      pxVar3->contextSize = iVar1;
      pxVar3->proximityPosition = iVar2;
    }
  }
  return;
}

Assistant:

static void
xmlXPathNodeSetFilter(xmlXPathParserContextPtr ctxt,
		      xmlNodeSetPtr set,
		      int filterOpIndex,
                      int minPos, int maxPos,
		      int hasNsNodes)
{
    xmlXPathContextPtr xpctxt;
    xmlNodePtr oldnode;
    xmlDocPtr olddoc;
    xmlXPathStepOpPtr filterOp;
    int oldcs, oldpp;
    int i, j, pos;

    if ((set == NULL) || (set->nodeNr == 0))
        return;

    /*
    * Check if the node set contains a sufficient number of nodes for
    * the requested range.
    */
    if (set->nodeNr < minPos) {
        xmlXPathNodeSetClear(set, hasNsNodes);
        return;
    }

    xpctxt = ctxt->context;
    oldnode = xpctxt->node;
    olddoc = xpctxt->doc;
    oldcs = xpctxt->contextSize;
    oldpp = xpctxt->proximityPosition;
    filterOp = &ctxt->comp->steps[filterOpIndex];

    xpctxt->contextSize = set->nodeNr;

    for (i = 0, j = 0, pos = 1; i < set->nodeNr; i++) {
        xmlNodePtr node = set->nodeTab[i];
        int res;

        xpctxt->node = node;
        xpctxt->proximityPosition = i + 1;

        /*
        * Also set the xpath document in case things like
        * key() are evaluated in the predicate.
        *
        * TODO: Get real doc for namespace nodes.
        */
        if ((node->type != XML_NAMESPACE_DECL) &&
            (node->doc != NULL))
            xpctxt->doc = node->doc;

        res = xmlXPathCompOpEvalToBoolean(ctxt, filterOp, 1);

        if (ctxt->error != XPATH_EXPRESSION_OK)
            break;
        if (res < 0) {
            /* Shouldn't happen */
            xmlXPathErr(ctxt, XPATH_EXPR_ERROR);
            break;
        }

        if ((res != 0) && ((pos >= minPos) && (pos <= maxPos))) {
            if (i != j) {
                set->nodeTab[j] = node;
                set->nodeTab[i] = NULL;
            }

            j += 1;
        } else {
            /* Remove the entry from the initial node set. */
            set->nodeTab[i] = NULL;
            if (node->type == XML_NAMESPACE_DECL)
                xmlXPathNodeSetFreeNs((xmlNsPtr) node);
        }

        if (res != 0) {
            if (pos == maxPos) {
                i += 1;
                break;
            }

            pos += 1;
        }
    }

    /* Free remaining nodes. */
    if (hasNsNodes) {
        for (; i < set->nodeNr; i++) {
            xmlNodePtr node = set->nodeTab[i];
            if ((node != NULL) && (node->type == XML_NAMESPACE_DECL))
                xmlXPathNodeSetFreeNs((xmlNsPtr) node);
        }
    }

    set->nodeNr = j;

    /* If too many elements were removed, shrink table to preserve memory. */
    if ((set->nodeMax > XML_NODESET_DEFAULT) &&
        (set->nodeNr < set->nodeMax / 2)) {
        xmlNodePtr *tmp;
        int nodeMax = set->nodeNr;

        if (nodeMax < XML_NODESET_DEFAULT)
            nodeMax = XML_NODESET_DEFAULT;
        tmp = (xmlNodePtr *) xmlRealloc(set->nodeTab,
                nodeMax * sizeof(xmlNodePtr));
        if (tmp == NULL) {
            xmlXPathPErrMemory(ctxt, "shrinking nodeset\n");
        } else {
            set->nodeTab = tmp;
            set->nodeMax = nodeMax;
        }
    }

    xpctxt->node = oldnode;
    xpctxt->doc = olddoc;
    xpctxt->contextSize = oldcs;
    xpctxt->proximityPosition = oldpp;
}